

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gui.test.cpp
# Opt level: O3

int main(void)

{
  char cVar1;
  size_t __i;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Vector3f local_13d8;
  float local_13c8;
  float local_13b8;
  undefined1 local_13a0 [8];
  ulong local_1398 [623];
  size_t local_20;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\ntestRgbToHsv()\n",0x10);
  uVar5 = 0;
  do {
    uVar3 = (uVar5 & 0xff) / 6;
    cVar1 = (char)uVar3;
    local_1398[0]._0_4_ = (float)(int)(char)((char)uVar5 + cVar1 * -6) / 5.0;
    auVar7._0_4_ = (float)((uVar5 & 0xff) / 0x24);
    auVar7._4_4_ = (float)(byte)(cVar1 + ((byte)(uVar3 / 3) & 0xfe) * -3);
    auVar7._8_8_ = 0;
    auVar7 = divps(auVar7,_DAT_00103050);
    local_13a0 = auVar7._0_8_;
    testRgbToHsv((Vector3f *)local_13a0);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0xd8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\ntestHsvToRgb()\n",0x10);
  uVar5 = 0;
  do {
    uVar3 = (uVar5 & 0xff) / 6;
    cVar1 = (char)uVar3;
    local_1398[0]._0_4_ = (float)(int)(char)((char)uVar5 + cVar1 * -6) / 5.0;
    auVar8._0_4_ = (float)((uVar5 & 0xff) / 0x24);
    auVar8._4_4_ = (float)(byte)(cVar1 + ((byte)(uVar3 / 3) & 0xfe) * -3);
    auVar8._8_8_ = 0;
    auVar7 = divps(auVar8,_DAT_00103050);
    local_13a0 = auVar7._0_8_;
    testHsvToRgb((Vector3f *)local_13a0);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0xd8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\ntest random samples\n",0x15);
  lVar2 = 1;
  uVar4 = 0x1571;
  do {
    uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar2);
    local_1398[lVar2 + -1] = uVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  local_13a0 = (undefined1  [8])0x7b;
  lVar2 = 1;
  uVar4 = 0x7b;
  do {
    uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar2);
    local_1398[lVar2 + -1] = uVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  local_20 = 0x270;
  iVar6 = 100;
  do {
    local_13b8 = std::
                 generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_13a0);
    local_13c8 = std::
                 generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_13a0);
    local_13d8.z = std::
                   generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                             ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                               *)local_13a0);
    local_13d8.z = local_13d8.z + 0.0;
    local_13d8.y = local_13c8 + 0.0;
    local_13d8.x = local_13b8 + 0.0;
    testRgbToHsv(&local_13d8);
    local_13b8 = std::
                 generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_13a0);
    local_13c8 = std::
                 generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_13a0);
    local_13d8.z = std::
                   generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                             ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                               *)local_13a0);
    local_13d8.z = local_13d8.z + 0.0;
    local_13d8.x = local_13b8 + 0.0;
    local_13d8.y = local_13c8 + 0.0;
    testHsvToRgb(&local_13d8);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  return 0;
}

Assistant:

int main() {
    constexpr int states = 6, states2 = states * states, states3 = states2 * states;
    std::cout << "\ntestRgbToHsv()\n";
    for (int i = 0; i < states3; ++i) {
        testRgbToHsv({
            static_cast<float>(i / states2 % states) / (states - 1),
            static_cast<float>(i / states % states) / (states - 1),
            static_cast<float>(i % states) / (states - 1)
        });
    }
    std::cout << "\ntestHsvToRgb()\n";
    for (int i = 0; i < states3; ++i) {
        testHsvToRgb({
            static_cast<float>(i / states2 % states) / (states - 1),
            static_cast<float>(i / states % states) / (states - 1),
            static_cast<float>(i % states) / (states - 1)
        });
    }
    std::cout << "\ntest random samples\n";
    std::mt19937 mersenneRand;
    mersenneRand.seed(123);
    std::uniform_real_distribution<float> dist(0.0f, 1.0f);
    for (int i = 0; i < 100; ++i) {
        testRgbToHsv({dist(mersenneRand), dist(mersenneRand), dist(mersenneRand)});
        testHsvToRgb({dist(mersenneRand), dist(mersenneRand), dist(mersenneRand)});
    }

    return 0;
}